

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::next_code_point<char>(char *begin,char *end)

{
  if (*begin < '\0') {
    if (begin + 1 != end) {
      end = begin + 1;
    }
    return end;
  }
  return begin + 1;
}

Assistant:

FMT_CONSTEXPR const Char* next_code_point(const Char* begin, const Char* end) {
  if (const_check(sizeof(Char) != 1) || (*begin & 0x80) == 0) return begin + 1;
  do {
    ++begin;
  } while (begin != end && (*begin & 0xc0) == 0x80);
  return begin;
}